

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

void __thiscall SQFunctionProto::Mark(SQFunctionProto *this,SQCollectable **chain)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  
  uVar1 = (this->super_SQCollectable).super_SQRefCounted._uiRef;
  if (-1 < (int)uVar1) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef = uVar1 | 0x80000000;
    if (0 < this->_nliterals) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        SQSharedState::MarkObject
                  ((SQObjectPtr *)((long)&(this->_literals->super_SQObject)._type + lVar3),
                   (SQCollectable_conflict **)chain);
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar2 < this->_nliterals);
    }
    if (0 < this->_nfunctions) {
      lVar3 = 0;
      lVar2 = 0;
      do {
        SQSharedState::MarkObject
                  ((SQObjectPtr *)((long)&(this->_functions->super_SQObject)._type + lVar3),
                   (SQCollectable_conflict **)chain);
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar2 < this->_nfunctions);
    }
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQFunctionProto::Mark(SQCollectable **chain)
{
    START_MARK()
        for(SQInteger i = 0; i < _nliterals; i++) SQSharedState::MarkObject(_literals[i], chain);
        for(SQInteger k = 0; k < _nfunctions; k++) SQSharedState::MarkObject(_functions[k], chain);
    END_MARK()
}